

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontTests.cpp
# Opt level: O1

void __thiscall agge::tests::FontTests::MissingGlyphIsReportedAsNull(FontTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  font *pfVar6;
  __node_base_ptr p_Var7;
  glyph *pgVar8;
  FailedAssertion *pFVar9;
  _Hash_node_base *p_Var10;
  ptr f;
  char_to_index indices [1];
  LocationInfo local_d8;
  string local_b0;
  font *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  string local_80;
  char_to_index local_60;
  glyph local_58;
  
  local_60.symbol = 0x41;
  local_60.index = 0;
  local_58.metrics.dx = 11.0;
  local_58.metrics.dy = 0.0;
  local_58.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mocks::create_font<1ul,1ul>
            ((mocks *)&local_90,(font_metrics *)&(anonymous_namespace)::c_fm1,
             (char_to_index (*) [1])&local_60,(glyph (*) [1])&local_58);
  pfVar6 = local_90;
  local_d8.filename._M_dataplus._M_p._0_4_ = 2;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (local_90->_glyphs).
                 super_unordered_map<unsigned_int,_agge::glyph,_agge::knuth_hash,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>_>
                 ._M_h._M_bucket_count;
  p_Var7 = std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_agge::glyph>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_agge::knuth_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     ((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_agge::glyph>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_agge::knuth_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&local_90->_glyphs,
                      SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x3c6ef362)) % auVar3,0),
                      (key_type *)&local_d8,0x3c6ef362);
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var10 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var10 = p_Var7->_M_nxt;
  }
  if (p_Var10 == (_Hash_node_base *)0x0) {
    pgVar8 = font::load_glyph(pfVar6,(glyph_index_t)local_d8.filename._M_dataplus._M_p);
  }
  else {
    pgVar8 = (glyph *)(p_Var10 + 2);
  }
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/FontTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_d8,&local_b0,0x1f);
  if (pgVar8 != (glyph *)0x0) {
    pFVar9 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Value is not null!","");
    ut::FailedAssertion::FailedAssertion(pFVar9,&local_80,&local_d8);
    __cxa_throw(pFVar9,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  paVar2 = &local_d8.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_d8.filename._M_dataplus._M_p._4_4_,
                  (glyph_index_t)local_d8.filename._M_dataplus._M_p) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_d8.filename._M_dataplus._M_p._4_4_,
                             (glyph_index_t)local_d8.filename._M_dataplus._M_p));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  pfVar6 = local_90;
  local_d8.filename._M_dataplus._M_p._0_4_ = 0x277f;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (local_90->_glyphs).
                 super_unordered_map<unsigned_int,_agge::glyph,_agge::knuth_hash,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>_>
                 ._M_h._M_bucket_count;
  p_Var7 = std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_agge::glyph>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_agge::knuth_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     ((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_agge::glyph>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_agge::knuth_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&local_90->_glyphs,
                      SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xf10f55cf)) % auVar4,0),
                      (key_type *)&local_d8,0xf10f55cf);
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var10 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var10 = p_Var7->_M_nxt;
  }
  if (p_Var10 == (_Hash_node_base *)0x0) {
    pgVar8 = font::load_glyph(pfVar6,(glyph_index_t)local_d8.filename._M_dataplus._M_p);
  }
  else {
    pgVar8 = (glyph *)(p_Var10 + 2);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/FontTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_d8,&local_b0,0x20);
  if (pgVar8 == (glyph *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_d8.filename._M_dataplus._M_p._4_4_,
                    (glyph_index_t)local_d8.filename._M_dataplus._M_p) != paVar2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_d8.filename._M_dataplus._M_p._4_4_,
                               (glyph_index_t)local_d8.filename._M_dataplus._M_p));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    local_d8.filename._M_dataplus._M_p._0_4_ = 1;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (local_90->_glyphs).
                   super_unordered_map<unsigned_int,_agge::glyph,_agge::knuth_hash,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>_>
                   ._M_h._M_bucket_count;
    p_Var7 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_agge::glyph>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_agge::knuth_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       ((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_agge::glyph>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_agge::knuth_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&local_90->_glyphs,
                        SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x9e3779b1)) % auVar5,0),
                        (key_type *)&local_d8,0x9e3779b1);
    if (p_Var7 == (__node_base_ptr)0x0) {
      p_Var10 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var10 = p_Var7->_M_nxt;
    }
    if (p_Var10 == (_Hash_node_base *)0x0) {
      pgVar8 = font::load_glyph(local_90,(glyph_index_t)local_d8.filename._M_dataplus._M_p);
    }
    else {
      pgVar8 = (glyph *)(p_Var10 + 2);
    }
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/FontTests.cpp"
               ,"");
    ut::LocationInfo::LocationInfo(&local_d8,&local_b0,0x21);
    if (pgVar8 == (glyph *)0x0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_d8.filename._M_dataplus._M_p._4_4_,
                      (glyph_index_t)local_d8.filename._M_dataplus._M_p) != paVar2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_d8.filename._M_dataplus._M_p._4_4_,
                                 (glyph_index_t)local_d8.filename._M_dataplus._M_p));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      if (local_58.outline.
          super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.outline.
                        super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    pFVar9 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Value is not null!","");
    ut::FailedAssertion::FailedAssertion(pFVar9,&local_80,&local_d8);
    __cxa_throw(pFVar9,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  pFVar9 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Value is not null!","");
  ut::FailedAssertion::FailedAssertion(pFVar9,&local_80,&local_d8);
  __cxa_throw(pFVar9,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( MissingGlyphIsReportedAsNull )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L'A', 0 }, };
				mocks::font_accessor::glyph glyphs[] = { { { 11, 0 } }, };
				font::ptr f = mocks::create_font(c_fm1, indices, glyphs);

				// ACT / ASSERT
				assert_null(f->get_glyph(2));
				assert_null(f->get_glyph(10111));
				assert_null(f->get_glyph(1));
			}